

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<float>(uint length,float value1,float value2,bool allowTrash)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  undefined8 *puVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  ulong uVar16;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  uint uVar18;
  long lVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var20;
  undefined1 auVar21 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var22;
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var28;
  float fVar29;
  float fVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<float> pv1;
  shared_ptr<float> pv2;
  shared_ptr<float> presult;
  
  uVar1 = (ulong)length;
  iVar12 = posix_memalign(&pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x10,(long)(int)length << 2);
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar12 == 0) {
    local_60 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_60,sse::common::free<float>);
  iVar12 = posix_memalign(&pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi,0x10,(long)(int)length << 2);
  pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar12 == 0) {
    pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<float>);
  iVar12 = posix_memalign(&local_68,0x10,(long)(int)(length + 1) << 2);
  if (iVar12 != 0) {
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_68,
             sse::common::free<float>);
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar1 * 4) = 0x42fe0000;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (0xf < (int)length) {
    do {
      *(float *)&p_Var14->_vptr__Sp_counted_base = value1;
      *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4) = value1;
      p_Var14->_M_use_count = (_Atomic_word)value1;
      p_Var14->_M_weak_count = (_Atomic_word)value1;
      *(float *)&p_Var14[1]._vptr__Sp_counted_base = value1;
      *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4) = value1;
      p_Var14[1]._M_use_count = (_Atomic_word)value1;
      p_Var14[1]._M_weak_count = (_Atomic_word)value1;
      *(float *)&p_Var14[2]._vptr__Sp_counted_base = value1;
      *(float *)((long)&p_Var14[2]._vptr__Sp_counted_base + 4) = value1;
      p_Var14[2]._M_use_count = (_Atomic_word)value1;
      p_Var14[2]._M_weak_count = (_Atomic_word)value1;
      *(float *)&p_Var14[3]._vptr__Sp_counted_base = value1;
      *(float *)((long)&p_Var14[3]._vptr__Sp_counted_base + 4) = value1;
      p_Var14[3]._M_use_count = (_Atomic_word)value1;
      p_Var14[3]._M_weak_count = (_Atomic_word)value1;
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 0x10;
      p_Var14 = p_Var14 + 4;
      uVar16 = (ulong)uVar18;
    } while (0x1f < iVar12);
  }
  if (7 < (int)uVar18) {
    *(float *)&p_Var14->_vptr__Sp_counted_base = value1;
    *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4) = value1;
    p_Var14->_M_use_count = (_Atomic_word)value1;
    p_Var14->_M_weak_count = (_Atomic_word)value1;
    *(float *)&p_Var14[1]._vptr__Sp_counted_base = value1;
    *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4) = value1;
    p_Var14[1]._M_use_count = (_Atomic_word)value1;
    p_Var14[1]._M_weak_count = (_Atomic_word)value1;
    uVar18 = uVar18 - 8;
    p_Var14 = p_Var14 + 2;
  }
  if (3 < (int)uVar18) {
    *(float *)&p_Var14->_vptr__Sp_counted_base = value1;
    *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4) = value1;
    p_Var14->_M_use_count = (_Atomic_word)value1;
    p_Var14->_M_weak_count = (_Atomic_word)value1;
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    do {
      *(float *)&p_Var14->_vptr__Sp_counted_base = value1;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var14->_vptr__Sp_counted_base + 4);
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  _Var20._vptr__Sp_counted_base = CONCAT44(value2,value2);
  _Var20._M_use_count = (_Atomic_word)value2;
  _Var20._M_weak_count = (_Atomic_word)value2;
  _Var15 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar16 = uVar1;
  uVar18 = length;
  if (0xf < (int)length) {
    do {
      *_Var15._M_pi = _Var20;
      _Var15._M_pi[1] = _Var20;
      _Var15._M_pi[2] = _Var20;
      _Var15._M_pi[3] = _Var20;
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 0x10;
      _Var15._M_pi = _Var15._M_pi + 4;
      uVar16 = (ulong)uVar18;
    } while (0x1f < iVar12);
  }
  if (7 < (int)uVar18) {
    *_Var15._M_pi = _Var20;
    _Var15._M_pi[1] = _Var20;
    uVar18 = uVar18 - 8;
    _Var15._M_pi = _Var15._M_pi + 2;
  }
  if (3 < (int)uVar18) {
    *_Var15._M_pi = _Var20;
    uVar18 = uVar18 - 4;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    do {
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base = value2;
      _Var15._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4);
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&local_60->_vptr__Sp_counted_base + uVar16 * 4);
      fVar24 = fVar25 - value1;
      uVar18 = -(uint)(fVar24 < 0.0);
      if ((1.1920929e-07 <= (float)(~uVar18 & (uint)fVar24 | (uint)(value1 - fVar25) & uVar18)) ||
         (fVar25 = *(float *)((long)&(pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4),
         fVar24 = fVar25 - value2, uVar18 = -(uint)(fVar24 < 0.0),
         1.1920929e-07 <= (float)(~uVar18 & (uint)fVar24 | (uint)(value2 - fVar25) & uVar18))) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x1a;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var17 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar24 = (float)p_Var14->_M_use_count;
      fVar26 = (float)p_Var14->_M_weak_count;
      fVar27 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar29 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar30 = (float)p_Var14[1]._M_use_count;
      fVar2 = (float)p_Var14[1]._M_weak_count;
      fVar3 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
      fVar4 = (float)(_Var17._M_pi)->_M_use_count;
      fVar5 = (float)(_Var17._M_pi)->_M_weak_count;
      fVar6 = *(float *)&_Var17._M_pi[1]._vptr__Sp_counted_base;
      fVar7 = *(float *)((long)&_Var17._M_pi[1]._vptr__Sp_counted_base + 4);
      fVar8 = (float)_Var17._M_pi[1]._M_use_count;
      fVar9 = (float)_Var17._M_pi[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base +
           *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 + fVar3;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar24 + fVar4);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar26 + fVar5);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar27 + fVar6;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar29 + fVar7;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar30 + fVar8);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar2 + fVar9);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar24 = (float)p_Var14->_M_use_count;
    fVar26 = (float)p_Var14->_M_weak_count;
    fVar27 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
    fVar29 = (float)(_Var17._M_pi)->_M_use_count;
    fVar30 = (float)(_Var17._M_pi)->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base +
         *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 + fVar27;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar24 + fVar29);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar26 + fVar30);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var17._M_pi = _Var17._M_pi + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) +
           *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  fVar25 = value1 + value2;
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar24 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar26 = fVar24 - fVar25;
      uVar18 = -(uint)(fVar26 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar26 | (uint)(fVar25 - fVar24) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x22;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var17 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar24 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar26 = (float)p_Var14->_M_use_count;
      fVar27 = (float)p_Var14->_M_weak_count;
      fVar29 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar30 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar2 = (float)p_Var14[1]._M_use_count;
      fVar3 = (float)p_Var14[1]._M_weak_count;
      fVar4 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
      fVar5 = (float)(_Var17._M_pi)->_M_use_count;
      fVar6 = (float)(_Var17._M_pi)->_M_weak_count;
      fVar7 = *(float *)&_Var17._M_pi[1]._vptr__Sp_counted_base;
      fVar8 = *(float *)((long)&_Var17._M_pi[1]._vptr__Sp_counted_base + 4);
      fVar9 = (float)_Var17._M_pi[1]._M_use_count;
      fVar10 = (float)_Var17._M_pi[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base -
           *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar24 - fVar4;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar26 - fVar5);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar27 - fVar6);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar29 - fVar7;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar30 - fVar8;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar2 - fVar9);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar3 - fVar10);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar24 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar26 = (float)p_Var14->_M_use_count;
    fVar27 = (float)p_Var14->_M_weak_count;
    fVar29 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
    fVar30 = (float)(_Var17._M_pi)->_M_use_count;
    fVar2 = (float)(_Var17._M_pi)->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base -
         *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar24 - fVar29;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar26 - fVar30);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar27 - fVar2);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var17._M_pi = _Var17._M_pi + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) -
           *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  fVar24 = value1 - value2;
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar26 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar27 = fVar26 - fVar24;
      uVar18 = -(uint)(fVar27 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar27 | (uint)(fVar24 - fVar26) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x2a;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var17 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar26 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar27 = (float)p_Var14->_M_use_count;
      fVar29 = (float)p_Var14->_M_weak_count;
      fVar30 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar2 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar3 = (float)p_Var14[1]._M_use_count;
      fVar4 = (float)p_Var14[1]._M_weak_count;
      fVar5 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
      fVar6 = (float)(_Var17._M_pi)->_M_use_count;
      fVar7 = (float)(_Var17._M_pi)->_M_weak_count;
      fVar8 = *(float *)&_Var17._M_pi[1]._vptr__Sp_counted_base;
      fVar9 = *(float *)((long)&_Var17._M_pi[1]._vptr__Sp_counted_base + 4);
      fVar10 = (float)_Var17._M_pi[1]._M_use_count;
      fVar11 = (float)_Var17._M_pi[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base *
           *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar26 * fVar5;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar27 * fVar6);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar29 * fVar7);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar30 * fVar8;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar2 * fVar9;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar3 * fVar10);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar4 * fVar11);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar26 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar27 = (float)p_Var14->_M_use_count;
    fVar29 = (float)p_Var14->_M_weak_count;
    fVar30 = *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + 4);
    fVar2 = (float)(_Var17._M_pi)->_M_use_count;
    fVar3 = (float)(_Var17._M_pi)->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base *
         *(float *)&(_Var17._M_pi)->_vptr__Sp_counted_base;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar26 * fVar30;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar27 * fVar2);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar29 * fVar3);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var17._M_pi = _Var17._M_pi + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) *
           *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  fVar26 = value1 * value2;
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar27 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar29 = fVar27 - fVar26;
      uVar18 = -(uint)(fVar29 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar29 | (uint)(fVar26 - fVar27) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x32;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15 = pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var17._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      _Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps((undefined1  [16])*p_Var14,(undefined1  [16])*_Var15._M_pi);
      _Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps((undefined1  [16])p_Var14[1],(undefined1  [16])_Var15._M_pi[1]);
      *_Var17._M_pi = _Var22;
      _Var17._M_pi[1] = _Var28;
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      _Var17._M_pi = _Var17._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    _Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divps((undefined1  [16])*p_Var14,(undefined1  [16])*_Var15._M_pi);
    *_Var17._M_pi = _Var22;
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
    _Var17._M_pi = _Var17._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var17._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) /
           *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  fVar27 = value1 / value2;
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar29 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar30 = fVar29 - fVar27;
      uVar18 = -(uint)(fVar30 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar30 | (uint)(fVar27 - fVar29) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x3a;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar29 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar30 = (float)p_Var14->_M_use_count;
      fVar2 = (float)p_Var14->_M_weak_count;
      fVar3 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar4 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar5 = (float)p_Var14[1]._M_use_count;
      fVar6 = (float)p_Var14[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base + value2;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar29 + value2;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar30 + value2);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar2 + value2);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar3 + value2;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar4 + value2;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar5 + value2);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar6 + value2);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar29 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar30 = (float)p_Var14->_M_use_count;
    fVar2 = (float)p_Var14->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base + value2;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar29 + value2;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar30 + value2);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar2 + value2);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) + value2;
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar29 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar30 = fVar29 - fVar25;
      uVar18 = -(uint)(fVar30 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar30 | (uint)(fVar25 - fVar29) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x43;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar29 = (float)p_Var14->_M_use_count;
      fVar30 = (float)p_Var14->_M_weak_count;
      fVar2 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar3 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar4 = (float)p_Var14[1]._M_use_count;
      fVar5 = (float)p_Var14[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base - value2;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 - value2;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar29 - value2);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar30 - value2);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar2 - value2;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar3 - value2;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar4 - value2);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar5 - value2);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar29 = (float)p_Var14->_M_use_count;
    fVar30 = (float)p_Var14->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base - value2;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 - value2;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar29 - value2);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar30 - value2);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) - value2;
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      if ((fVar25 != fVar24) || (NAN(fVar25) || NAN(fVar24))) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x4b;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar24 = (float)p_Var14->_M_use_count;
      fVar29 = (float)p_Var14->_M_weak_count;
      fVar30 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar2 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar3 = (float)p_Var14[1]._M_use_count;
      fVar4 = (float)p_Var14[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           value2 - *(float *)&p_Var14->_vptr__Sp_counted_base;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = value2 - fVar25;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(value2 - fVar24);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(value2 - fVar29);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = value2 - fVar30;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - fVar2;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(value2 - fVar3);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(value2 - fVar4);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar24 = (float)p_Var14->_M_use_count;
    fVar29 = (float)p_Var14->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         value2 - *(float *)&p_Var14->_vptr__Sp_counted_base;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = value2 - fVar25;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(value2 - fVar24);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(value2 - fVar29);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           value2 - *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar24 = fVar25 - (value2 - value1);
      uVar18 = -(uint)(fVar24 < 0.0);
      if (1.1920929e-07 <=
          (float)(~uVar18 & (uint)fVar24 | (uint)((value2 - value1) - fVar25) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x53;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
      fVar24 = (float)p_Var14->_M_use_count;
      fVar29 = (float)p_Var14->_M_weak_count;
      fVar30 = *(float *)&p_Var14[1]._vptr__Sp_counted_base;
      fVar2 = *(float *)((long)&p_Var14[1]._vptr__Sp_counted_base + 4);
      fVar3 = (float)p_Var14[1]._M_use_count;
      fVar4 = (float)p_Var14[1]._M_weak_count;
      *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
           *(float *)&p_Var14->_vptr__Sp_counted_base * value2;
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 * value2;
      (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar24 * value2);
      (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar29 * value2);
      *(float *)&_Var15._M_pi[1]._vptr__Sp_counted_base = fVar30 * value2;
      *(float *)((long)&_Var15._M_pi[1]._vptr__Sp_counted_base + 4) = fVar2 * value2;
      _Var15._M_pi[1]._M_use_count = (_Atomic_word)(fVar3 * value2);
      _Var15._M_pi[1]._M_weak_count = (_Atomic_word)(fVar4 * value2);
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    fVar25 = *(float *)((long)&p_Var14->_vptr__Sp_counted_base + 4);
    fVar24 = (float)p_Var14->_M_use_count;
    fVar29 = (float)p_Var14->_M_weak_count;
    *(float *)&(_Var15._M_pi)->_vptr__Sp_counted_base =
         *(float *)&p_Var14->_vptr__Sp_counted_base * value2;
    *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + 4) = fVar25 * value2;
    (_Var15._M_pi)->_M_use_count = (_Atomic_word)(fVar24 * value2);
    (_Var15._M_pi)->_M_weak_count = (_Atomic_word)(fVar29 * value2);
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) * value2;
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      if ((fVar25 != fVar26) || (NAN(fVar25) || NAN(fVar26))) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x5b;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var14 = local_60;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      _Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps((undefined1  [16])*p_Var14,(undefined1  [16])_Var20);
      _Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps((undefined1  [16])p_Var14[1],(undefined1  [16])_Var20);
      *_Var15._M_pi = _Var22;
      _Var15._M_pi[1] = _Var28;
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    _Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divps((undefined1  [16])*p_Var14,(undefined1  [16])_Var20);
    *_Var15._M_pi = _Var22;
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19) / value2;
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar24 = fVar25 - fVar27;
      uVar18 = -(uint)(fVar24 < 0.0);
      if (1.1920929e-07 <= (float)(~uVar18 & (uint)fVar24 | (uint)(fVar27 - fVar25) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 99;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  p_Var14 = local_60;
  _Var15._M_pi = pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar16 = uVar1;
  uVar18 = length;
  if (7 < (int)length) {
    do {
      auVar21._8_4_ = value2;
      auVar21._0_8_ = _Var20._vptr__Sp_counted_base;
      auVar21._12_4_ = value2;
      _Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps(auVar21,(undefined1  [16])*p_Var14);
      auVar23._8_4_ = value2;
      auVar23._0_8_ = _Var20._vptr__Sp_counted_base;
      auVar23._12_4_ = value2;
      _Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divps(auVar23,(undefined1  [16])p_Var14[1]);
      *_Var15._M_pi = _Var22;
      _Var15._M_pi[1] = _Var28;
      iVar12 = (int)uVar16;
      uVar18 = iVar12 - 8;
      p_Var14 = p_Var14 + 2;
      _Var15._M_pi = _Var15._M_pi + 2;
      uVar16 = (ulong)uVar18;
    } while (0xf < iVar12);
  }
  if (3 < (int)uVar18) {
    _Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divps((undefined1  [16])_Var20,(undefined1  [16])*p_Var14);
    *_Var15._M_pi = _Var20;
    uVar18 = uVar18 - 4;
    p_Var14 = p_Var14 + 1;
    _Var15._M_pi = _Var15._M_pi + 1;
  }
  if (0 < (int)uVar18) {
    iVar12 = uVar18 + 1;
    lVar19 = 0;
    do {
      *(float *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar19) =
           value2 / *(float *)((long)&p_Var14->_vptr__Sp_counted_base + lVar19);
      lVar19 = lVar19 + 4;
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
  }
  if (length != 0) {
    uVar16 = 0;
    do {
      fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar16 * 4);
      fVar24 = fVar25 - value2 / value1;
      uVar18 = -(uint)(fVar24 < 0.0);
      if (1.1920929e-07 <=
          (float)(~uVar18 & (uint)fVar24 | (uint)(value2 / value1 - fVar25) & uVar18)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
        *(undefined4 *)(puVar13 + 1) = 0x6b;
        *(uint *)((long)puVar13 + 0xc) = length;
        __cxa_throw(puVar13,&Exception::typeinfo,0);
      }
      uVar16 = uVar16 + 1;
    } while (uVar1 != uVar16);
  }
  if ((!allowTrash) &&
     ((fVar25 = *(float *)((long)&(pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar1 * 4),
      fVar25 != 127.0 || (NAN(fVar25))))) {
    puVar13 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar13 = "void test_arithm(unsigned int, T, T, bool) [T = float]";
    *(undefined4 *)(puVar13 + 1) = 0x70;
    *(uint *)((long)puVar13 + 0xc) = length;
    __cxa_throw(puVar13,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}